

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O2

void __thiscall
ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation
          (ON_OBSOLETE_V5_Annotation *this,ON_OBSOLETE_V2_Annotation *V2_annotation,
          ON_3dmAnnotationContext *annotation_context)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  wchar_t *text_value;
  V5_TextDisplayMode VVar4;
  long lVar5;
  ON_wString *src;
  ON_Plane *pOVar6;
  ON_Plane *pOVar7;
  ON_Plane *this_00;
  int i;
  int iVar8;
  byte bVar9;
  ON_2dVector OVar10;
  ON_2dPoint OVar11;
  ON_wString text;
  ON_2dVector v;
  ON_2dPoint v5_point;
  ON_2dPoint V2_point;
  double local_a0;
  
  bVar9 = 0;
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    annotation_context = &ON_3dmAnnotationContext::Default;
  }
  SetTextFormula(this,(wchar_t *)0x0);
  bVar1 = ON_wString::IsNotEmpty(&V2_annotation->m_usertext);
  src = &V2_annotation->m_defaulttext;
  if (bVar1) {
    src = &V2_annotation->m_usertext;
  }
  ON_wString::ON_wString(&text,src);
  ON_wString::TrimLeftAndRight(&text,(wchar_t *)0x0);
  text_value = ON_wString::operator_cast_to_wchar_t_(&text);
  SetTextValue(this,text_value);
  iVar3 = ON_OBSOLETE_V2_Annotation::PointCount(V2_annotation);
  if ((iVar3 < 1) ||
     (bVar1 = ON_2dPoint::IsValid((V2_annotation->m_points).m_a),
     !bVar1 || V2_annotation->m_type == dtDimAngular)) {
    v.x = ON_2dVector::ZeroVector.x;
    v.y = ON_2dVector::ZeroVector.y;
  }
  else {
    OVar10 = ON_2dPoint::operator-(&ON_2dPoint::Origin,(V2_annotation->m_points).m_a);
    v.y = OVar10.y;
    v.x = OVar10.x;
  }
  if (-1 < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity) {
    (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
  }
  ON_SimpleArray<ON_2dPoint>::Reserve
            (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,(long)iVar3);
  if (0 < iVar3) {
    ON_SimpleArray<ON_2dPoint>::Append
              (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,&ON_2dPoint::Origin);
  }
  for (iVar8 = 1; iVar8 < iVar3; iVar8 = iVar8 + 1) {
    OVar11 = ON_OBSOLETE_V2_Annotation::Point(V2_annotation,iVar8);
    V2_point.y = OVar11.y;
    V2_point.x = OVar11.x;
    bVar1 = ON_2dPoint::IsValid(&V2_point);
    if (bVar1) {
      OVar11 = ON_2dPoint::operator+(&V2_point,&v);
      v5_point.y = OVar11.y;
      v5_point.x = OVar11.x;
    }
    else {
      v5_point.x = V2_point.x;
      v5_point.y = V2_point.y;
    }
    SetPoint(this,iVar8,&v5_point);
  }
  ON_OBSOLETE_V2_Annotation::Plane((ON_Plane *)&V2_point,V2_annotation);
  this_00 = &this->m_plane;
  pOVar6 = (ON_Plane *)&V2_point;
  pOVar7 = this_00;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pOVar7->origin).x = (pOVar6->origin).x;
    pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar9 * -0x10 + 8);
    pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar9 * -0x10 + 8);
  }
  ON_Plane::~ON_Plane((ON_Plane *)&V2_point);
  ON_Plane::UpdateEquation(this_00);
  bVar1 = ON_Plane::IsValid(this_00);
  if (bVar1) {
    bVar1 = ON_2dVector::IsNotZero(&v);
    if (bVar1) {
      ON_Plane::PointAt((ON_3dPoint *)&V2_point,this_00,-v.x,-v.y);
      (this->m_plane).origin.z = local_a0;
      (this_00->origin).x = V2_point.x;
      (this->m_plane).origin.y = V2_point.y;
      ON_Plane::UpdateEquation(this_00);
    }
  }
  else {
    pOVar6 = &ON_Plane::World_xy;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      (this_00->origin).x = (pOVar6->origin).x;
      pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar9 * -2 + 1) * 8);
      this_00 = (ON_Plane *)((long)this_00 + (ulong)bVar9 * -0x10 + 8);
    }
  }
  this->m_textheight = 1.0;
  bVar9 = 1;
  iVar3 = -1;
  switch(V2_annotation->m_type) {
  default:
    this->m_textdisplaymode = kNormal;
  case dtTextBlock:
  case dtDimOrdinate:
    bVar2 = false;
LAB_004d226e:
    VVar4 = kNormal;
    bVar1 = false;
    iVar8 = iVar3;
    break;
  case dtDimLinear:
  case dtDimAligned:
    iVar8 = 5;
    bVar1 = true;
    VVar4 = kAboveLine;
    bVar2 = false;
    bVar9 = 0;
    iVar3 = iVar8;
    break;
  case dtDimAngular:
    bVar2 = ON_OBSOLETE_V2_Annotation::UserPositionedText(V2_annotation);
    iVar8 = 2;
    bVar1 = true;
    VVar4 = kAboveLine;
    bVar9 = 0;
    iVar3 = 3;
    break;
  case dtDimDiameter:
  case dtDimRadius:
    bVar2 = ON_OBSOLETE_V2_Annotation::UserPositionedText(V2_annotation);
    goto LAB_004d226e;
  case dtLeader:
    iVar8 = 2;
    bVar1 = true;
    VVar4 = kInLine;
    bVar2 = false;
    bVar9 = 1;
  }
  this->m_textdisplaymode = VVar4;
  this->m_userpositionedtext = bVar2;
  if (((bool)(iVar3 < iVar8 | bVar9)) ||
     ((this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count <= iVar3)) {
    if ((bVar1) &&
       (((this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count < iVar8 &&
        (-1 < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity)))) {
      (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
    }
  }
  else if (iVar3 <= (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity) {
    (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = iVar3;
  }
  iVar3 = ON_3dmAnnotationContext::V5_ArchiveDimStyleIndex(annotation_context);
  SetV5_3dmArchiveDimStyleIndex(this,iVar3);
  ON_wString::~ON_wString(&text);
  return;
}

Assistant:

void ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation(
  const class ON_OBSOLETE_V2_Annotation& V2_annotation,
  const class ON_3dmAnnotationContext* annotation_context
)
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  //const ON_3dmAnnotationSettings& annotation_settings = annotation_context->AnnotationSettings();

  SetTextFormula(nullptr);

  ON_wString text
    = (V2_annotation.m_usertext.IsNotEmpty())
    ? V2_annotation.m_usertext
    : V2_annotation.m_defaulttext;
  text.TrimLeftAndRight();

  SetTextValue(text);

  // 30 Oct 2013 - Lowell - changed to copy the number of points in V2_annotation.PointCount() instead of always 5
  const int V2_point_count = V2_annotation.PointCount();
  const ON_2dVector v
    = (V2_point_count > 0 && V2_annotation.m_points[0].IsValid() && ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular != V2_annotation.m_type)
    ? (ON_2dPoint::Origin - V2_annotation.m_points[0])
    : ON_2dVector::ZeroVector;

  m_points.SetCount(0);
  m_points.Reserve(V2_point_count);
  if (V2_point_count > 0)
    m_points.Append(ON_2dPoint::Origin);
  for (int i = 1; i < V2_point_count; i++)
  {
    const ON_2dPoint V2_point = V2_annotation.Point(i);
    ON_2dPoint v5_point
      = V2_point.IsValid()
      ? V2_point + v
      : V2_point;
    SetPoint(i, v5_point);
  }

  m_plane = V2_annotation.Plane();
  m_plane.UpdateEquation();
  if (false == m_plane.IsValid())
    m_plane = ON_Plane::World_xy;
  else if (v.IsNotZero())
  {
    m_plane.origin = m_plane.PointAt(-v.x, -v.y);
    m_plane.UpdateEquation();
  }

  m_textheight = 1.0;

  ON_INTERNAL_OBSOLETE::V5_TextDisplayMode text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
  bool bUserPositionedText = false;
  int min_point_count = -1;
  int max_point_count = -1;

  switch (V2_annotation.m_type)
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing:
    m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    min_point_count = ON_OBSOLETE_V5_DimLinear::dim_pt_count;
    max_point_count = ON_OBSOLETE_V5_DimLinear::dim_pt_count;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    min_point_count = 2;
    max_point_count = 3;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
    bUserPositionedText = false;
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine;
    min_point_count = 2;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    break;

  default:
    m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
    break;
  }

  m_textdisplaymode = text_display_mode;
  m_userpositionedtext = bUserPositionedText;

  if (max_point_count > 0 && max_point_count >= min_point_count && m_points.Count() > max_point_count)
    m_points.SetCount(max_point_count);
  else if (min_point_count >= 0 && m_points.Count() < min_point_count)
    m_points.SetCount(0);

  SetV5_3dmArchiveDimStyleIndex(annotation_context->V5_ArchiveDimStyleIndex());
}